

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O1

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_>::Restore
          (TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_> *this)

{
  TPZCompElH1<pzshape::TPZShapeQuad> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapeQuad> *)operator_new(200);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0199e2f0;
  memset(this_00,0,0xbc);
  TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1(this_00,&PTR_PTR_01998d20);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01998950;
  return (TPZSavable *)this_00;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }